

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusinternalfilters.cpp
# Opt level: O3

QVariantMap * operator+=(QVariantMap *lhs,QVariantMap *rhs)

{
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  
  pQVar1 = (rhs->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var2 != p_Var3; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    QMap<QString,_QVariant>::insert(lhs,(QString *)(p_Var2 + 1),(QVariant *)&p_Var2[1]._M_right);
  }
  return lhs;
}

Assistant:

static QVariantMap &operator+=(QVariantMap &lhs, const QVariantMap &rhs)
{
    for (const auto &[key, value] : rhs.asKeyValueRange())
        lhs.insert(key, value);
    return lhs;
}